

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::setCapacity
          (Vector<capnp::compiler::NodeTranslator::UnfinishedValue> *this,size_t newSize)

{
  UnfinishedValue *pUVar1;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar2;
  UnfinishedValue *pUVar3;
  ulong uVar4;
  size_t __n;
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> local_48;
  
  pUVar1 = (this->builder).ptr;
  uVar4 = ((long)(this->builder).pos - (long)pUVar1 >> 4) * -0x71c71c71c71c71c7;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    (this->builder).pos = pUVar1 + newSize;
  }
  pUVar3 = (UnfinishedValue *)
           _::HeapArrayDisposer::allocateImpl
                     (0x90,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_48.endPtr = pUVar3 + newSize;
  local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pUVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pUVar1;
  local_48.ptr = pUVar3;
  if (__n != 0) {
    memcpy(pUVar3,pUVar1,__n);
  }
  local_48.pos = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)
                 ((long)pUVar3 + __n);
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::operator=
            (&this->builder,&local_48);
  pUVar3 = local_48.endPtr;
  pRVar2 = local_48.pos;
  pUVar1 = local_48.ptr;
  if (local_48.ptr != (UnfinishedValue *)0x0) {
    local_48.ptr = (UnfinishedValue *)0x0;
    local_48.pos = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)0x0;
    local_48.endPtr = (UnfinishedValue *)0x0;
    (*(code *)**(undefined8 **)local_48.disposer)
              (local_48.disposer,pUVar1,0x90,
               ((long)pRVar2 - (long)pUVar1 >> 4) * -0x71c71c71c71c71c7,
               ((long)pUVar3 - (long)pUVar1 >> 4) * -0x71c71c71c71c71c7,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }